

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_comm_emulator.c
# Opt level: O1

int power_on_simulator(TPM_COMM_INFO *tpm_comm_info)

{
  int iVar1;
  TPM_SOCKET_HANDLE handle;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  uint32_t ack_value;
  uint32_t signal_nv_cmd;
  uint32_t power_on_cmd;
  int local_1c;
  uchar local_18 [8];
  
  handle = tpm_socket_create(tpm_comm_info->socket_ip,0x912);
  if (handle == (TPM_SOCKET_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x68;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_comm_emulator.c"
              ,"power_on_simulator",0x67,1,
              "Failure: connecting to tpm simulator platform interface.");
    return 0x68;
  }
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\x01';
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\v';
  iVar1 = tpm_socket_send(handle,local_18 + 4,4);
  if (iVar1 == 0) {
    iVar1 = tpm_socket_read(handle,(uchar *)&local_1c,4);
    if (iVar1 == 0) {
      if (local_1c == 0) {
        iVar1 = tpm_socket_send(handle,local_18,4);
        if (iVar1 == 0) {
          iVar1 = tpm_socket_read(handle,(uchar *)&local_1c,4);
          if (iVar1 == 0) {
            if (local_1c == 0) {
              iVar1 = 0;
              goto LAB_0010e5e6;
            }
            p_Var2 = xlogging_get_log_function();
            iVar1 = 0x96;
            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010e5e6;
            pcVar4 = "Failure reading cmd sync.";
            iVar3 = 0x95;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            iVar1 = 0x8f;
            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010e5e6;
            pcVar4 = "Failure sending remote handshake.";
            iVar3 = 0x8e;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          iVar1 = 0x88;
          if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010e5e6;
          pcVar4 = "Failure sending remote handshake.";
          iVar3 = 0x87;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x81;
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010e5e6;
        pcVar4 = "Failure reading cmd sync.";
        iVar3 = 0x80;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x7a;
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010e5e6;
      pcVar4 = "Failure sending remote handshake.";
      iVar3 = 0x79;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x72;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010e5e6;
    pcVar4 = "Failure sending remote handshake.";
    iVar3 = 0x71;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_comm_emulator.c"
            ,"power_on_simulator",iVar3,1,pcVar4);
LAB_0010e5e6:
  tpm_socket_destroy(handle);
  return iVar1;
}

Assistant:

static int power_on_simulator(TPM_COMM_INFO* tpm_comm_info)
{
    int result;
    TPM_SOCKET_HANDLE platform_conn;

    if ((platform_conn = tpm_socket_create(tpm_comm_info->socket_ip, TPM_SIMULATOR_PLATFORM_PORT) ) == NULL)
    {
        LogError("Failure: connecting to tpm simulator platform interface.");
        result = MU_FAILURE;
    }
    else
    {
        uint32_t power_on_cmd = htonl(REMOTE_SIGNAL_POWER_ON_CMD);
        uint32_t signal_nv_cmd = htonl(REMOTE_SIGNAL_NV_ON_CMD);

        if (tpm_socket_send(platform_conn, (const unsigned char*)&power_on_cmd, sizeof(power_on_cmd) ) != 0)
        {
            LogError("Failure sending remote handshake.");
            result = MU_FAILURE;
        }
        else
        {
            uint32_t ack_value;
            if (tpm_socket_read(platform_conn, (unsigned char*)&ack_value, sizeof(uint32_t)) != 0)
            {
                LogError("Failure sending remote handshake.");
                result = MU_FAILURE;
            }
            else
            {
                if (htonl(ack_value) != 0)
                {
                    LogError("Failure reading cmd sync.");
                    result = MU_FAILURE;
                }
                else
                {
                    if (tpm_socket_send(platform_conn, (const unsigned char*)&signal_nv_cmd, sizeof(signal_nv_cmd) ) != 0)
                    {
                        LogError("Failure sending remote handshake.");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (tpm_socket_read(platform_conn, (unsigned char*)&ack_value, sizeof(uint32_t)) != 0)
                        {
                            LogError("Failure sending remote handshake.");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            if (htonl(ack_value) != 0)
                            {
                                LogError("Failure reading cmd sync.");
                                result = MU_FAILURE;
                            }
                            else
                            {
                                result = 0;
                            }
                        }
                    }
                }
            }
        }
        tpm_socket_destroy(platform_conn);
    }
    return result;
}